

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

word Sfm_LibTruth6Two(Mio_Cell2_t *pCellBot,Mio_Cell2_t *pCellTop,int InTop)

{
  word wVar1;
  word uTruthBot;
  int k;
  int i;
  word uFanins [8];
  int InTop_local;
  Mio_Cell2_t *pCellTop_local;
  Mio_Cell2_t *pCellBot_local;
  
  wVar1 = Exp_Truth6(*(uint *)&pCellBot->field_0x10 >> 0x1c,pCellBot->vExpr,(word *)0x0);
  if ((InTop < 0) || ((int)(*(uint *)&pCellTop->field_0x10 >> 0x1c) <= InTop)) {
    __assert_fail("InTop >= 0 && InTop < (int)pCellTop->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                  ,0x100,"word Sfm_LibTruth6Two(Mio_Cell2_t *, Mio_Cell2_t *, int)");
  }
  uTruthBot._4_4_ = 0;
  uTruthBot._0_4_ = *(uint *)&pCellBot->field_0x10 >> 0x1c;
  for (; uTruthBot._4_4_ < (int)(*(uint *)&pCellTop->field_0x10 >> 0x1c);
      uTruthBot._4_4_ = uTruthBot._4_4_ + 1) {
    if (uTruthBot._4_4_ == InTop) {
      *(word *)(&k + (long)uTruthBot._4_4_ * 2) = wVar1;
    }
    else {
      *(word *)(&k + (long)uTruthBot._4_4_ * 2) = s_Truths6[(int)(uint)uTruthBot];
      uTruthBot._0_4_ = (uint)uTruthBot + 1;
    }
  }
  if ((*(uint *)&pCellBot->field_0x10 >> 0x1c) + (*(uint *)&pCellTop->field_0x10 >> 0x1c) ==
      (uint)uTruthBot + 1) {
    wVar1 = Exp_Truth6(*(uint *)&pCellTop->field_0x10 >> 0x1c,pCellTop->vExpr,(word *)&k);
    return wVar1;
  }
  __assert_fail("(int)pCellBot->nFanins + (int)pCellTop->nFanins == k + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                ,0x106,"word Sfm_LibTruth6Two(Mio_Cell2_t *, Mio_Cell2_t *, int)");
}

Assistant:

word Sfm_LibTruth6Two( Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop )
{
    word uFanins[SFM_SUPP_MAX]; int i, k;
    word uTruthBot = Exp_Truth6( pCellBot->nFanins, pCellBot->vExpr, NULL );
    assert( InTop >= 0 && InTop < (int)pCellTop->nFanins );
    for ( i = 0, k = pCellBot->nFanins; i < (int)pCellTop->nFanins; i++ )
        if ( i == InTop )
            uFanins[i] = uTruthBot;
        else
            uFanins[i] = s_Truths6[k++];
    assert( (int)pCellBot->nFanins + (int)pCellTop->nFanins == k + 1 );
    uTruthBot = Exp_Truth6( pCellTop->nFanins, pCellTop->vExpr, uFanins );
    return uTruthBot;
}